

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuInfo.cpp
# Opt level: O0

int __thiscall primesieve::CpuInfo::init(CpuInfo *this,EVP_PKEY_CTX *ctx)

{
  undefined1 uVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  reference pvVar5;
  string *in_stack_00000058;
  string sharedCpuMap;
  string sharedCpuList;
  string cacheSize;
  string cacheType;
  string type;
  size_t level;
  string cacheLevel;
  string path;
  size_t i;
  string threadSiblings;
  string threadSiblingsList;
  string cpusOnline;
  char *in_stack_fffffffffffffdf8;
  string *in_stack_fffffffffffffe00;
  string *in_stack_fffffffffffffe08;
  undefined6 in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe26;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe28;
  allocator<char> *in_stack_fffffffffffffe30;
  char *in_stack_fffffffffffffe38;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string local_1a0 [16];
  string *in_stack_fffffffffffffe70;
  string local_180 [32];
  string local_160 [32];
  string *in_stack_fffffffffffffec0;
  string local_120 [32];
  size_t local_100;
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  ulong local_98;
  allocator<char> local_89;
  string local_88 [39];
  undefined1 local_61 [56];
  allocator<char> local_29;
  string local_28 [32];
  CpuInfo *local_8;
  
  local_8 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  std::allocator<char>::~allocator(&local_29);
  sVar4 = anon_unknown.dwarf_e925f::parseThreadList(in_stack_fffffffffffffec0);
  this->cpuThreads_ = sVar4;
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_61;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  std::allocator<char>::~allocator((allocator<char> *)local_61);
  __s = &local_89;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,in_stack_fffffffffffffe30);
  std::allocator<char>::~allocator(&local_89);
  sVar4 = anon_unknown.dwarf_e925f::getThreads(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  this->threadsPerCore_ = sVar4;
  if (this->threadsPerCore_ == 0) {
    std::__cxx11::string::operator=
              ((string *)(local_61 + 1),"/sys/devices/system/cpu/cpu0/topology/thread_siblings_list"
              );
    std::__cxx11::string::operator=
              (local_88,"/sys/devices/system/cpu/cpu0/topology/thread_siblings");
    in_stack_fffffffffffffe28 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         anon_unknown.dwarf_e925f::getThreads(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
    this->threadsPerCore_ = (size_t)in_stack_fffffffffffffe28;
  }
  uVar1 = hasCpuThreads(this);
  if (((bool)uVar1) &&
     (in_stack_fffffffffffffe26 = hasThreadsPerCore(this), (bool)in_stack_fffffffffffffe26)) {
    this->cpuCores_ = this->cpuThreads_ / this->threadsPerCore_;
  }
  for (local_98 = 0; local_98 < 4; local_98 = local_98 + 1) {
    std::__cxx11::to_string((unsigned_long)__s);
    std::operator+((char *)in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
    std::__cxx11::string::~string(local_d8);
    std::operator+(in_stack_fffffffffffffe28,
                   (char *)CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffe26,
                                                   in_stack_fffffffffffffe20)));
    local_100 = anon_unknown.dwarf_e925f::getValue(this_00);
    if ((local_100 != 0) && (local_100 < 4)) {
      std::operator+(in_stack_fffffffffffffe28,
                     (char *)CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffe26,
                                                     in_stack_fffffffffffffe20)));
      anon_unknown.dwarf_e925f::getString(in_stack_00000058);
      bVar2 = std::operator==(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      if ((bVar2) ||
         (bVar2 = std::operator==(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8), bVar2)) {
        std::operator+(in_stack_fffffffffffffe28,
                       (char *)CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffe26,
                                                       in_stack_fffffffffffffe20)));
        std::operator+(in_stack_fffffffffffffe28,
                       (char *)CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffe26,
                                                       in_stack_fffffffffffffe20)));
        std::operator+(in_stack_fffffffffffffe28,
                       (char *)CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffe26,
                                                       in_stack_fffffffffffffe20)));
        in_stack_fffffffffffffe08 =
             (string *)anon_unknown.dwarf_e925f::getCacheSize(in_stack_fffffffffffffe70);
        pvVar5 = std::array<unsigned_long,_4UL>::operator[]
                           ((array<unsigned_long,_4UL> *)in_stack_fffffffffffffe00,
                            (size_type)in_stack_fffffffffffffdf8);
        *pvVar5 = (value_type_conflict3)in_stack_fffffffffffffe08;
        in_stack_fffffffffffffe00 =
             (string *)
             anon_unknown.dwarf_e925f::getThreads
                       (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
        pvVar5 = std::array<unsigned_long,_4UL>::operator[]
                           ((array<unsigned_long,_4UL> *)in_stack_fffffffffffffe00,
                            (size_type)in_stack_fffffffffffffdf8);
        *pvVar5 = (value_type_conflict3)in_stack_fffffffffffffe00;
        std::__cxx11::string::~string(local_1a0);
        std::__cxx11::string::~string(local_180);
        std::__cxx11::string::~string(local_160);
      }
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffec0);
      std::__cxx11::string::~string(local_120);
    }
    std::__cxx11::string::~string(local_f8);
    std::__cxx11::string::~string(local_b8);
  }
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string((string *)(local_61 + 1));
  iVar3 = std::__cxx11::string::~string(local_28);
  return iVar3;
}

Assistant:

void CpuInfo::init()
{
  string cpusOnline = "/sys/devices/system/cpu/online";
  cpuThreads_ = parseThreadList(cpusOnline);

  // Works on Linux kernel >= 5.3
  string threadSiblingsList = "/sys/devices/system/cpu/cpu0/topology/core_cpus_list";
  string threadSiblings = "/sys/devices/system/cpu/cpu0/topology/core_cpus";
  threadsPerCore_ = getThreads(threadSiblingsList, threadSiblings);

  if (!threadsPerCore_)
  {
    // Works on Linux kernel < 5.3
    threadSiblingsList = "/sys/devices/system/cpu/cpu0/topology/thread_siblings_list";
    threadSiblings = "/sys/devices/system/cpu/cpu0/topology/thread_siblings";
    threadsPerCore_ = getThreads(threadSiblingsList, threadSiblings);
  }

  if (hasCpuThreads() &&
      hasThreadsPerCore())
    cpuCores_ = cpuThreads_ / threadsPerCore_;

  // Retrieve CPU cache info
  for (size_t i = 0; i <= 3; i++)
  {
    string path = "/sys/devices/system/cpu/cpu0/cache/index" + to_string(i);
    string cacheLevel = path + "/level";
    size_t level = getValue(cacheLevel);

    if (level >= 1 &&
        level <= 3)
    {
      string type = path + "/type";
      string cacheType = getString(type);

      if (cacheType == "Data" ||
          cacheType == "Unified")
      {
        string cacheSize = path + "/size";
        string sharedCpuList = path + "/shared_cpu_list";
        string sharedCpuMap = path + "/shared_cpu_map";
        cacheSizes_[level] = getCacheSize(cacheSize);
        cacheSharing_[level] = getThreads(sharedCpuList, sharedCpuMap);
      }
    }
  }
}